

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O1

void __thiscall
setup::info::try_load(info *this,istream *is,entry_types entries,codepage_id force_codepage)

{
  header *this_00;
  pointer plVar1;
  _Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false> _Var2;
  istream *piVar3;
  bool bVar4;
  codepage_id cVar5;
  pointer plVar6;
  bool bVar7;
  long lVar8;
  pointer reader;
  _Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false> local_40;
  istream *local_38;
  
  if ((((ulong)entries._flags.super__Base_bitset<1UL>._M_w & 0x80200) != 0) ||
     ((force_codepage == 0 &&
      (((this->version).variant._flags.super__Base_bitset<1UL>._M_w & 2) == 0)))) {
    entries._flags.super__Base_bitset<1UL>._M_w =
         (Type)((ulong)entries._flags.super__Base_bitset<1UL>._M_w | 0x100);
  }
  stream::block_reader::get((block_reader *)&local_40,is,&this->version);
  this_00 = &this->header;
  header::load(this_00,local_40._M_head_impl,&this->version);
  load_entries<setup::language_entry>
            (this,local_40._M_head_impl,entries,(this->header).language_count,&this->languages,
             Languages);
  cVar5 = 0x4b0;
  if ((((this->version).variant._flags.super__Base_bitset<1UL>._M_w & 2) == 0) &&
     (cVar5 = force_codepage, force_codepage == 0)) {
    plVar6 = (this->languages).
             super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>.
             _M_impl.super__Vector_impl_data._M_start;
    plVar1 = (this->languages).
             super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (plVar6 != plVar1) {
      this->codepage = plVar6->codepage;
      do {
        bVar4 = false;
        do {
          bVar7 = bVar4;
          if (bVar7) {
            lVar8 = 0x178;
            goto LAB_00139ecf;
          }
          bVar4 = true;
        } while (plVar6->codepage != 0x4e4);
        this->codepage = 0x4e4;
        lVar8 = 0;
LAB_00139ecf:
        plVar6 = (pointer)((long)&(plVar6->name)._M_dataplus._M_p + lVar8);
      } while ((bool)(bVar7 & plVar6 != plVar1));
      goto LAB_00139b79;
    }
    cVar5 = 0x4e4;
  }
  this->codepage = cVar5;
LAB_00139b79:
  header::decode(this_00,this->codepage);
  plVar1 = (this->languages).
           super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (plVar6 = (this->languages).
                super__Vector_base<setup::language_entry,_std::allocator<setup::language_entry>_>.
                _M_impl.super__Vector_impl_data._M_start; plVar6 != plVar1; plVar6 = plVar6 + 1) {
    language_entry::decode(plVar6,this->codepage);
  }
  if ((this->version).value < 0x4000000) {
    anon_unknown_21::load_wizard_and_decompressor
              (local_40._M_head_impl,&this->version,this_00,this,entries);
  }
  load_entries<setup::message_entry>
            (this,local_40._M_head_impl,entries,(this->header).message_count,&this->messages,
             Messages);
  load_entries<setup::permission_entry>
            (this,local_40._M_head_impl,entries,(this->header).permission_count,&this->permissions,
             Permissions);
  load_entries<setup::type_entry>
            (this,local_40._M_head_impl,entries,(this->header).type_count,&this->types,Types);
  load_entries<setup::component_entry>
            (this,local_40._M_head_impl,entries,(this->header).component_count,&this->components,
             Components);
  load_entries<setup::task_entry>
            (this,local_40._M_head_impl,entries,(this->header).task_count,&this->tasks,Tasks);
  load_entries<setup::directory_entry>
            (this,local_40._M_head_impl,entries,(this->header).directory_count,&this->directories,
             Directories);
  load_entries<setup::file_entry>
            (this,local_40._M_head_impl,entries,(this->header).file_count,&this->files,Files);
  load_entries<setup::icon_entry>
            (this,local_40._M_head_impl,entries,(this->header).icon_count,&this->icons,Icons);
  load_entries<setup::ini_entry>
            (this,local_40._M_head_impl,entries,(this->header).ini_entry_count,&this->ini_entries,
             IniEntries);
  load_entries<setup::registry_entry>
            (this,local_40._M_head_impl,entries,(this->header).registry_entry_count,
             &this->registry_entries,RegistryEntries);
  load_entries<setup::delete_entry>
            (this,local_40._M_head_impl,entries,(this->header).delete_entry_count,
             &this->delete_entries,DeleteEntries);
  load_entries<setup::delete_entry>
            (this,local_40._M_head_impl,entries,(this->header).uninstall_delete_entry_count,
             &this->uninstall_delete_entries,UninstallDeleteEntries);
  load_entries<setup::run_entry>
            (this,local_40._M_head_impl,entries,(this->header).run_entry_count,&this->run_entries,
             RunEntries);
  load_entries<setup::run_entry>
            (this,local_40._M_head_impl,entries,(this->header).uninstall_run_entry_count,
             &this->uninstall_run_entries,UninstallRunEntries);
  if (0x3ffffff < (this->version).value) {
    anon_unknown_21::load_wizard_and_decompressor
              (local_40._M_head_impl,&this->version,this_00,this,entries);
  }
  anon_unknown_21::check_is_end((pointer *)&local_40,"unknown data at end of primary header stream")
  ;
  stream::block_reader::get((block_reader *)&local_38,is,&this->version);
  piVar3 = local_38;
  _Var2._M_head_impl = local_40._M_head_impl;
  local_38 = (istream *)0x0;
  local_40._M_head_impl = piVar3;
  if (_Var2._M_head_impl != (istream *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_basic_istream[1])();
  }
  if (local_38 != (istream *)0x0) {
    (**(code **)(*(long *)local_38 + 8))();
  }
  load_entries<setup::data_entry>
            (this,local_40._M_head_impl,entries,(this->header).data_entry_count,&this->data_entries,
             DataEntries);
  anon_unknown_21::check_is_end
            ((pointer *)&local_40,"unknown data at end of secondary header stream");
  if (local_40._M_head_impl != (istream *)0x0) {
    (*(local_40._M_head_impl)->_vptr_basic_istream[1])();
  }
  return;
}

Assistant:

void info::try_load(std::istream & is, entry_types entries, util::codepage_id force_codepage) {
	
	debug("trying to load setup headers for version " << version);
	
	if((entries & (Messages | NoSkip)) || (!version.is_unicode() && !force_codepage)) {
		entries |= Languages;
	}
	
	stream::block_reader::pointer reader = stream::block_reader::get(is, version);
	
	debug("loading main header");
	header.load(*reader, version);
	
	debug("loading languages");
	load_entries(*reader, entries, header.language_count, languages, Languages);
	
	debug("determining encoding");
	if(version.is_unicode()) {
		// Unicode installers are always UTF16-LE, do not allow users to override that.
		codepage = util::cp_utf16le;
	} else if(force_codepage) {
		codepage = force_codepage;
	} else if(languages.empty()) {
		codepage = util::cp_windows1252;
	} else {
		// Non-Unicode installers do not have a defined codepage but instead just assume the
		// codepage of the system the installer is run on.
		// Look at the list of available languages to guess a suitable codepage.
		codepage = languages[0].codepage;
		BOOST_FOREACH(const language_entry & language, languages) {
			if(language.codepage == util::cp_windows1252) {
				codepage = util::cp_windows1252;
				break;
			}
		}
	}
	
	header.decode(codepage);
	BOOST_FOREACH(language_entry & language, languages) {
		language.decode(codepage);
	}
	
	if(version < INNO_VERSION(4, 0, 0)) {
		debug("loading images and plugins");
		load_wizard_and_decompressor(*reader, version, header, *this, entries);
	}
	
	debug("loading messages");
	load_entries(*reader, entries, header.message_count, messages, Messages);
	debug("loading permissions");
	load_entries(*reader, entries, header.permission_count, permissions, Permissions);
	debug("loading types");
	load_entries(*reader, entries, header.type_count, types, Types);
	debug("loading components");
	load_entries(*reader, entries, header.component_count, components, Components);
	debug("loading tasks");
	load_entries(*reader, entries, header.task_count, tasks, Tasks);
	debug("loading directories");
	load_entries(*reader, entries, header.directory_count, directories, Directories);
	debug("loading files");
	load_entries(*reader, entries, header.file_count, files, Files);
	debug("loading icons");
	load_entries(*reader, entries, header.icon_count, icons, Icons);
	debug("loading ini entries");
	load_entries(*reader, entries, header.ini_entry_count, ini_entries, IniEntries);
	debug("loading registry entries");
	load_entries(*reader, entries, header.registry_entry_count, registry_entries, RegistryEntries);
	debug("loading delete entries");
	load_entries(*reader, entries, header.delete_entry_count, delete_entries, DeleteEntries);
	debug("loading uninstall delete entries");
	load_entries(*reader, entries, header.uninstall_delete_entry_count, uninstall_delete_entries,
	             UninstallDeleteEntries);
	debug("loading run entries");
	load_entries(*reader, entries, header.run_entry_count, run_entries, RunEntries);
	debug("loading uninstall run entries");
	load_entries(*reader, entries, header.uninstall_run_entry_count, uninstall_run_entries,
	             UninstallRunEntries);
	
	if(version >= INNO_VERSION(4, 0, 0)) {
		debug("loading images and plugins");
		load_wizard_and_decompressor(*reader, version, header, *this, entries);
	}
	
	// restart the compression stream
	check_is_end(reader, "unknown data at end of primary header stream");
	reader = stream::block_reader::get(is, version);
	
	debug("loading data entries");
	load_entries(*reader, entries, header.data_entry_count, data_entries, DataEntries);
	
	check_is_end(reader, "unknown data at end of secondary header stream");
}